

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test::Body
          (iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *p;
  AssertionResult iutest_ar;
  allocator<char> local_1f9;
  AssertionResult local_1f8;
  undefined1 local_1d0 [32];
  char *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [392];
  
  iutest::internal::NullHelper<false>::CompareNe<void>(&local_1f8,"(T<0, 0>::call(p))",this);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    local_1d0._0_8_ = this;
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,(void **)local_1d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
    local_1b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
    local_1a8._0_4_ = 0x18e;
    local_1a8._4_4_ = 2;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1d0,(Fixed *)local_1a0,false);
    if ((iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test *)local_1d0._0_8_ !=
        (iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test *)(local_1d0 + 0x10)) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p == &local_1f8.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_1f8.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_message._M_dataplus._M_p,
                      local_1f8.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::NullHelper<false>::CompareNe<void>(&local_1f8,"(T<0, 0>::call(p))",this);
    if (local_1f8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      local_1d0._0_8_ = this;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,(void **)local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
      local_1b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
      local_1a8._0_4_ = 400;
      local_1a8._4_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1d0,(Fixed *)local_1a0,false);
      if ((iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test *)local_1d0._0_8_ !=
          (iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test *)(local_1d0 + 0x10)) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_message._M_dataplus._M_p,
                      local_1f8.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::NullHelper<false>::CompareNe<void>(&local_1f8,"(T<0, 0>::call(p))",this);
    if (local_1f8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      local_1d0._0_8_ = this;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,(void **)local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
      local_1b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
      local_1a8._0_4_ = 0x192;
      local_1a8._4_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1d0,(Fixed *)local_1a0,false);
      if ((iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test *)local_1d0._0_8_ !=
          (iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test *)(local_1d0 + 0x10)) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_message._M_dataplus._M_p,
                      local_1f8.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::NullHelper<false>::CompareNe<void>(&local_1f8,"(T<0, 0>::call(p))",this);
    if (local_1f8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      local_1d0._0_8_ = this;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,(void **)local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
      local_1b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
      local_1a8._0_4_ = 0x194;
      local_1a8._4_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1d0,(Fixed *)local_1a0,false);
      if ((iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test *)local_1d0._0_8_ !=
          (iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test *)(local_1d0 + 0x10)) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_1f8.m_message._M_dataplus._M_p,
                  local_1f8.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST(SyntaxTest, VariadicNotNull)
{
    if( void* p = this )
        IUTEST_ASSERT_NOTNULL(T<0, 0>::call(p)) << p;
    if( void* p = this )
        IUTEST_EXPECT_NOTNULL(T<0, 0>::call(p)) << p;
    if( void* p = this )
        IUTEST_INFORM_NOTNULL(T<0, 0>::call(p)) << p;
    if( void* p = this )
        IUTEST_ASSUME_NOTNULL(T<0, 0>::call(p)) << p;
}